

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O0

void gravity_function_special_serialize(gravity_function_t *f,char *key,json_t *json)

{
  gravity_function_t *pgVar1;
  char *key_00;
  gravity_function_t *f2_1;
  gravity_function_t *f2;
  char *label;
  json_t *json_local;
  char *key_local;
  gravity_function_t *f_local;
  
  key_00 = json_get_label(json,key);
  json_begin_object(json,key_00);
  json_add_cstring(json,"type","function");
  json_add_cstring(json,"identifier",key);
  json_add_int(json,"tag",(ulong)f->tag);
  json_add_int(json,"nparam",(ulong)f->nparams);
  json_add_bool(json,"args",(_Bool)((f->field_9).field_0.useargs & 1));
  json_add_int(json,"index",(ulong)(f->field_9).field_2.index);
  if ((f->field_9).field_0.cpool.m != 0) {
    pgVar1 = (gravity_function_t *)(f->field_9).field_2.special[0];
    pgVar1->identifier = "$get";
    gravity_function_serialize(pgVar1,json);
    pgVar1->identifier = (char *)0x0;
  }
  if ((f->field_9).field_0.cpool.p != (gravity_value_t *)0x0) {
    pgVar1 = (gravity_function_t *)(f->field_9).field_2.special[1];
    pgVar1->identifier = "$set";
    gravity_function_serialize(pgVar1,json);
    pgVar1->identifier = (char *)0x0;
  }
  json_end_object(json);
  return;
}

Assistant:

void gravity_function_special_serialize (gravity_function_t *f, const char *key, json_t *json) {
    const char *label = json_get_label(json, key);
    json_begin_object(json, label);

    json_add_cstring(json, GRAVITY_JSON_LABELTYPE, GRAVITY_JSON_FUNCTION);    // MANDATORY 1st FIELD
    json_add_cstring(json, GRAVITY_JSON_LABELIDENTIFIER, key);                // MANDATORY 2nd FIELD
    json_add_int(json, GRAVITY_JSON_LABELTAG, f->tag);

    // common fields
    json_add_int(json, GRAVITY_JSON_LABELNPARAM, f->nparams);
    json_add_bool(json, GRAVITY_JSON_LABELARGS, f->useargs);
    json_add_int(json, GRAVITY_JSON_LABELINDEX, f->index);

    if (f->special[0]) {
        gravity_function_t *f2 = (gravity_function_t*)f->special[0];
        f2->identifier = GRAVITY_JSON_GETTER;
        gravity_function_serialize(f2, json);
        f2->identifier = NULL;
    }
    if (f->special[1]) {
        gravity_function_t *f2 = (gravity_function_t*)f->special[1];
        f2->identifier = GRAVITY_JSON_SETTER;
        gravity_function_serialize(f2, json);
        f2->identifier = NULL;
    }

    json_end_object(json);
}